

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O0

string * __thiscall
choc::text::CodePrinter::toString_abi_cxx11_(string *__return_storage_ptr__,CodePrinter *this)

{
  bool bVar1;
  reference pLVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  char *local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  size_t local_88;
  size_t contentLen_1;
  Line *l_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_> *__range2_1;
  size_t contentLen;
  Line *l;
  const_iterator __end2;
  const_iterator __begin2;
  vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_> *__range2;
  size_t totalLen;
  CodePrinter *this_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>::size
            (&this->lines);
  std::__cxx11::string::length();
  __end2 = std::
           vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>::
           begin(&this->lines);
  l = (Line *)std::
              vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
              ::end(&this->lines);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_choc::text::CodePrinter::Line_*,_std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>_>
                                     *)&l), bVar1) {
    pLVar2 = __gnu_cxx::
             __normal_iterator<const_choc::text::CodePrinter::Line_*,_std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>_>
             ::operator*(&__end2);
    getLengthWithTrimmedEnd(&pLVar2->line);
    __gnu_cxx::
    __normal_iterator<const_choc::text::CodePrinter::Line_*,_std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end2_1 = std::
             vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>::
             begin(&this->lines);
  l_1 = (Line *)std::
                vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
                ::end(&this->lines);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_choc::text::CodePrinter::Line_*,_std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>_>
                             *)&l_1), bVar1) {
    contentLen_1 = (size_t)__gnu_cxx::
                           __normal_iterator<const_choc::text::CodePrinter::Line_*,_std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>_>
                           ::operator*(&__end2_1);
    local_88 = getLengthWithTrimmedEnd(&((reference)contentLen_1)->line);
    if (local_88 != 0) {
      std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)*(undefined8 *)contentLen_1);
      local_90._M_current = (char *)std::__cxx11::string::begin();
      local_a0._M_current = (char *)std::__cxx11::string::begin();
      local_98 = (char *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&local_a0,local_88);
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)__return_storage_ptr__,local_90,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_98);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_choc::text::CodePrinter::Line_*,_std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>_>
    ::operator++(&__end2_1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string CodePrinter::toString() const
{
    std::string s;
    auto totalLen = lines.size() * newLineString.length() + 1;

    for (auto& l : lines)
        if (auto contentLen = getLengthWithTrimmedEnd (l.line))
            totalLen += l.indent + contentLen;

    s.reserve (totalLen);

    for (auto& l : lines)
    {
        if (auto contentLen = getLengthWithTrimmedEnd (l.line))
        {
            s.append (l.indent, ' ');
            s.append (l.line.begin(), l.line.begin() + static_cast<std::string::difference_type> (contentLen));
        }

        s.append (newLineString);
    }

    return s;
}